

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O2

void __thiscall JitFFI::SysV64::ArgOPList::add(ArgOPList *this,uint id,OP op,uint num)

{
  undefined7 in_register_00000011;
  value_type local_2c;
  
  if ((int)CONCAT71(in_register_00000011,op) != 4) {
    ArgOPCounter::add(&this->counter,op);
    local_2c.op = op;
    local_2c.id = id;
    local_2c.num = num;
    std::__cxx11::
    list<JitFFI::SysV64::ArgOPList::Data,_std::allocator<JitFFI::SysV64::ArgOPList::Data>_>::
    push_back((list<JitFFI::SysV64::ArgOPList::Data,_std::allocator<JitFFI::SysV64::ArgOPList::Data>_>
               *)&this->datalist,&local_2c);
    return;
  }
  __assert_fail("op != ArgTypeInfo::op_struct",
                "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                ,0x259,
                "void JitFFI::SysV64::ArgOPList::add(unsigned int, ArgTypeInfo::OP, unsigned int)");
}

Assistant:

void add(unsigned int id, ArgTypeInfo::OP op, unsigned int num = 0) {
				assert(op != ArgTypeInfo::op_struct);
				counter.add(op);
				datalist.add({ op, id, num });
			}